

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_matrix_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,SPIRType *target_type,uint32_t offset,uint32_t matrix_stride,
          bool need_transpose)

{
  uint32_t i;
  uint uVar1;
  uint32_t uVar2;
  string local_1a0;
  SPIRType local_180;
  
  if (matrix_stride != 0) {
    SPIRType::SPIRType(&local_180,target_type);
    if (need_transpose) {
      uVar2 = local_180.columns;
      local_180.columns = local_180.vecsize;
      local_180.vecsize = uVar2;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    type_to_glsl_constructor_abi_cxx11_(&local_1a0,this,&local_180);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_1a0);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (uVar1 = 0; uVar1 < local_180.columns; uVar1 = uVar1 + 1) {
      if (uVar1 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      flattened_access_chain_vector_abi_cxx11_
                (&local_1a0,this,base,indices,count,&local_180,offset,matrix_stride,false);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_1a0);
      offset = offset + matrix_stride;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    SPIRType::~SPIRType(&local_180);
    return __return_storage_ptr__;
  }
  __assert_fail("matrix_stride",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                ,0x2ace,
                "std::string spirv_cross::CompilerGLSL::flattened_access_chain_matrix(uint32_t, const uint32_t *, uint32_t, const SPIRType &, uint32_t, uint32_t, bool)"
               );
}

Assistant:

std::string CompilerGLSL::flattened_access_chain_matrix(uint32_t base, const uint32_t *indices, uint32_t count,
                                                        const SPIRType &target_type, uint32_t offset,
                                                        uint32_t matrix_stride, bool need_transpose)
{
	assert(matrix_stride);
	SPIRType tmp_type = target_type;
	if (need_transpose)
		swap(tmp_type.vecsize, tmp_type.columns);

	std::string expr;

	expr += type_to_glsl_constructor(tmp_type);
	expr += "(";

	for (uint32_t i = 0; i < tmp_type.columns; i++)
	{
		if (i != 0)
			expr += ", ";

		expr += flattened_access_chain_vector(base, indices, count, tmp_type, offset + i * matrix_stride, matrix_stride,
		                                      /* need_transpose= */ false);
	}

	expr += ")";

	return expr;
}